

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_intlog.cpp
# Opt level: O2

void __thiscall
bitmanip::anon_unknown_0::Test_intlog_log10floor_approximate_table_::run
          (Test_intlog_log10floor_approximate_table_ *this)

{
  SourceLocation loc;
  string_view msg;
  Table<unsigned_char,_64UL> table;
  uint64_t local_128;
  char *local_120;
  char *pcStack_118;
  undefined8 local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_88;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_68;
  Table<unsigned_char,_64UL> local_48;
  
  builtin_memcpy(local_48.data + 0x30,
                 "\x0e\x0e\x0f\x0f\x0f\x0f\x10\x10\x10\x11\x11\x11\x12\x12\x12\x12",0x10);
  builtin_memcpy(local_48.data + 0x20,"\t\t\n\n\n\v\v\v\f\f\f\f\r\r\r\x0e",0x10);
  builtin_memcpy(local_48.data + 0x10,"\x04\x05\x05\x05\x06\x06\x06\x06\a\a\a\b\b\b\t\t",0x10);
  local_48.data[0] = '\0';
  local_48.data[1] = '\0';
  local_48.data[2] = '\0';
  local_48.data[3] = '\0';
  local_48.data[4] = '\x01';
  local_48.data[5] = '\x01';
  local_48.data[6] = '\x01';
  local_48.data[7] = '\x02';
  local_48.data[8] = '\x02';
  local_48.data[9] = '\x02';
  local_48.data[10] = '\x03';
  local_48.data[0xb] = '\x03';
  local_48.data[0xc] = '\x03';
  local_48.data[0xd] = '\x03';
  local_48.data[0xe] = '\x04';
  local_48.data[0xf] = '\x04';
  local_128 = detail::approximateGuessTable<64ul>(&local_48);
  if (local_128 != 0xffffffffffffffff) {
    return;
  }
  stringify<unsigned_long>(&local_68,&local_128);
  std::operator+(&local_e8,
                 "Comparison failed: detail::approximateGuessTable(table) != detail::NO_APPROXIMATION (with \"detail::approximateGuessTable(table)\"="
                 ,&local_68);
  std::operator+(&local_c8,&local_e8,", \"detail::NO_APPROXIMATION\"=");
  stringify<unsigned_long>(&local_88,&detail::NO_APPROXIMATION);
  std::operator+(&local_a8,&local_c8,&local_88);
  std::operator+(&local_108,&local_a8,")");
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
  pcStack_118 = "run";
  local_110 = 0x2f;
  loc.function = "run";
  loc.file = 
  "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
  loc.line = 0x2f;
  msg._M_str = local_108._M_dataplus._M_p;
  msg._M_len = local_108._M_string_length;
  assertFail(msg,loc);
}

Assistant:

BITMANIP_TEST(intlog, log10floor_approximate_table)
{
    auto table = detail::makeGuessTable<std::uint64_t, 10>();
    BITMANIP_ASSERT_NE(detail::approximateGuessTable(table), detail::NO_APPROXIMATION);
}